

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Quoted_String_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                 *this)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  eval_error *this_00;
  byte bVar4;
  char *pcVar5;
  int iVar6;
  byte bVar7;
  char cVar8;
  allocator<char> local_59;
  File_Position local_58;
  string local_50;
  
  pcVar3 = (this->m_position).m_pos;
  if (pcVar3 == (this->m_position).m_end) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    if (*pcVar3 == '\"') {
      cVar8 = '\"';
      bVar7 = 0;
      do {
        do {
          Position::operator++(&this->m_position);
          do {
            pcVar3 = (this->m_position).m_pos;
            if (pcVar3 == (this->m_position).m_end) {
              this_00 = (eval_error *)__cxa_allocate_exception(0x90);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"Unclosed quoted string",&local_59);
              local_58.line = (this->m_position).line;
              local_58.column = (this->m_position).col;
              exception::eval_error::eval_error
                        (this_00,&local_50,&local_58,
                         (this->m_filename).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              __cxa_throw(this_00,&exception::eval_error::typeinfo,
                          exception::eval_error::~eval_error);
            }
            if (((*pcVar3 == '\"') && (iVar6 < 1)) && (cVar8 != '\\')) {
              Position::operator++(&this->m_position);
              iVar6 = 1;
              goto LAB_0056b6ec;
            }
            bVar2 = Eol_(this,false);
          } while (bVar2);
          pcVar3 = (this->m_position).m_pos;
          pcVar1 = (this->m_position).m_end;
          if (cVar8 != '\\') {
            if (cVar8 == '$') {
              pcVar5 = pcVar3;
              if (pcVar3 == pcVar1) {
                pcVar5 = "";
              }
              if (*pcVar5 == '{') {
                iVar6 = iVar6 + 1;
                pcVar3 = pcVar5;
                break;
              }
            }
            pcVar5 = pcVar3;
            if (pcVar3 == pcVar1) {
              pcVar5 = "";
            }
            if (*pcVar5 == '\"') {
              bVar7 = bVar7 ^ 1;
              pcVar3 = pcVar5;
              break;
            }
          }
          if (pcVar3 == pcVar1) {
            pcVar3 = "";
          }
          bVar4 = 0;
          if (*pcVar3 == '}') {
            bVar4 = ~bVar7 & 1;
          }
          iVar6 = iVar6 - (uint)bVar4;
          bVar2 = cVar8 == '\\';
          cVar8 = '\0';
        } while (bVar2);
        cVar8 = *pcVar3;
      } while( true );
    }
  }
LAB_0056b6ec:
  return SUB41(iVar6,0);
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }